

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::advance(QGraphicsScene *this)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  QList<QGraphicsItem_*> *__range2;
  long lVar4;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  do {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
              (&local_58,*(long **)(*(long *)(this + 8) + 0x88),1);
    if (local_48 != (undefined1 *)0x0) {
      lVar3 = CONCAT44(uStack_4c,uStack_50);
      lVar5 = (long)local_48 << 3;
      lVar4 = 0;
      do {
        plVar1 = *(long **)(lVar3 + lVar4);
        (**(code **)(*plVar1 + 0x10))(plVar1,iVar6);
        lVar4 = lVar4 + 8;
      } while (lVar5 != lVar4);
    }
    piVar2 = (int *)CONCAT44(uStack_54,local_58);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
      }
    }
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + 1;
  } while (bVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::advance()
{
    for (int i = 0; i < 2; ++i) {
        const auto items_ = items();
        for (QGraphicsItem *item : items_)
            item->advance(i);
    }
}